

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O3

int xmlC14NProcessNodeList(xmlC14NCtxPtr ctx,xmlNodePtr cur)

{
  xmlC14NVisibleNsStackPtr p_Var1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  xmlChar *pxVar8;
  xmlNodePtr pxVar9;
  xmlNodePtr pxVar10;
  char *str1;
  xmlOutputBufferPtr out;
  char *msg;
  char *pcVar11;
  _xmlNode *p_Var12;
  xmlNs *pxVar13;
  ulong uVar14;
  long lVar15;
  xmlNs ns_default;
  xmlListPtr local_98;
  int local_8c;
  xmlNs local_88;
  ulong local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (cur == (xmlNodePtr)0x0) {
    return 0;
  }
  do {
    iVar5 = 1;
    if (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0) {
      iVar5 = (*ctx->is_visible_callback)(ctx->user_data,cur,cur->parent);
    }
    iVar7 = 0;
    iVar6 = 0;
    switch(cur->type) {
    case XML_ELEMENT_NODE:
      for (pxVar13 = cur->nsDef; pxVar13 != (xmlNs *)0x0; pxVar13 = pxVar13->next) {
        iVar6 = xmlStrlen(pxVar13->href);
        if (0 < iVar6) {
          iVar6 = xmlParseURISafe((char *)pxVar13->href,(xmlURIPtr *)&local_88);
          if ((xmlURIPtr)local_88.next == (xmlURIPtr)0x0) {
            if (iVar6 < 0) {
              if (ctx == (xmlC14NCtxPtr)0x0) goto LAB_0015ebfc;
              goto LAB_0015ebf5;
            }
            msg = "%s";
            pcVar11 = "parsing namespace uri";
            iVar5 = 0x5b;
            str1 = (char *)0x0;
            goto LAB_0015ec85;
          }
          iVar6 = xmlStrlen((xmlChar *)(local_88.next)->next);
          if (iVar6 == 0) {
            xmlC14NErrFull(ctx,(xmlNodePtr)0x0,0x7a3,(char *)(local_88.next)->next,
                           "Relative namespace UR is invalid here : %s\n",(local_88.next)->next);
            xmlFreeURI((xmlURIPtr)local_88.next);
            return -1;
          }
          xmlFreeURI((xmlURIPtr)local_88.next);
        }
      }
      p_Var1 = ctx->ns_rendered;
      if (p_Var1 == (xmlC14NVisibleNsStackPtr)0x0) {
        uVar14 = 0;
        xmlC14NErrFull((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0);
        local_48 = 0;
      }
      else {
        local_48._0_4_ = p_Var1->nsCurEnd;
        local_48._4_4_ = p_Var1->nsPrevStart;
        uVar14 = (ulong)(uint)p_Var1->nsPrevEnd;
      }
      uStack_40 = 0;
      if (iVar5 == 0) {
        local_8c = 0;
      }
      else {
        local_8c = ctx->parent_is_doc;
        if (local_8c != 0) {
          ctx->pos = XMLC14N_INSIDE_DOCUMENT_ELEMENT;
          ctx->parent_is_doc = 0;
        }
        xmlOutputBufferWriteString(ctx->buf,"<");
        if ((cur->ns != (xmlNs *)0x0) && (iVar6 = xmlStrlen(cur->ns->prefix), 0 < iVar6)) {
          xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
          xmlOutputBufferWriteString(ctx->buf,":");
        }
        xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
      }
      local_50 = uVar14;
      if (ctx->mode == XML_C14N_EXCLUSIVE_1_0) {
        if (cur->type != XML_ELEMENT_NODE) {
LAB_0015ecc9:
          msg = "Invalid argument\n";
          cur = (xmlNodePtr)0x0;
          iVar5 = 0x73;
          str1 = (char *)0x0;
          pcVar11 = (char *)0x0;
          goto LAB_0015ec85;
        }
        local_98 = xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
        if (local_98 == (xmlListPtr)0x0) {
LAB_0015ebf5:
          ctx->error = 2;
LAB_0015ebfc:
          xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x15,
                              (xmlError *)0x0);
          return -1;
        }
        if ((ctx->inclusive_ns_prefixes == (xmlChar **)0x0) ||
           (pxVar8 = *ctx->inclusive_ns_prefixes, pxVar8 == (xmlChar *)0x0)) {
          bVar2 = false;
          bVar4 = false;
        }
        else {
          bVar4 = false;
          lVar15 = 8;
          bVar2 = false;
          do {
            iVar6 = xmlStrEqual(pxVar8,(xmlChar *)"#default");
            if ((iVar6 != 0) || (iVar6 = xmlStrEqual(pxVar8,""), iVar6 != 0)) {
              bVar4 = true;
              pxVar8 = (xmlChar *)0x0;
            }
            pxVar9 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,pxVar8);
            if (((pxVar9 != (xmlNodePtr)0x0) &&
                (iVar6 = xmlC14NIsXmlNs((xmlNsPtr)pxVar9), iVar6 == 0)) &&
               ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur), iVar6 != 0)))) {
              iVar6 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar9);
              if ((iVar5 != 0) &&
                 (iVar7 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar9,cur), iVar7 < 0
                 )) goto LAB_0015e996;
              if (iVar6 == 0) {
                xmlListInsert(local_98,pxVar9);
              }
              iVar6 = xmlStrlen((xmlChar *)pxVar9->children);
              if (iVar6 == 0) {
                bVar2 = true;
              }
            }
            pxVar8 = *(xmlChar **)((long)ctx->inclusive_ns_prefixes + lVar15);
            lVar15 = lVar15 + 8;
          } while (pxVar8 != (xmlChar *)0x0);
        }
        bVar3 = false;
        pxVar9 = (xmlNodePtr)cur->ns;
        if (pxVar9 == (xmlNodePtr)0x0) {
          pxVar9 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)0x0);
          bVar3 = true;
          if (pxVar9 != (xmlNodePtr)0x0) goto LAB_0015e7ad;
LAB_0015e824:
          for (pxVar9 = (xmlNodePtr)cur->properties; pxVar9 != (xmlNodePtr)0x0;
              pxVar9 = pxVar9->next) {
            if (pxVar9->ns != (xmlNsPtr)0x0) {
              iVar6 = xmlC14NIsXmlNs(pxVar9->ns);
              if ((iVar6 == 0) &&
                 ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                  (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur), iVar6 != 0)))) {
                iVar6 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,pxVar9->ns,ctx);
                iVar7 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,pxVar9->ns,cur);
                if (iVar7 < 0) goto LAB_0015e996;
                if ((iVar5 != 0) && (iVar6 == 0)) {
                  xmlListInsert(local_98,pxVar9->ns);
                }
                iVar6 = xmlStrlen(pxVar9->ns->prefix);
                if (iVar6 == 0) {
                  bVar2 = true;
                }
              }
              else if ((pxVar9->ns != (xmlNs *)0x0) &&
                      (iVar6 = xmlStrlen(pxVar9->ns->prefix), iVar6 == 0)) {
                iVar6 = xmlStrlen(pxVar9->ns->href);
                if (iVar6 == 0) {
                  bVar3 = true;
                }
              }
            }
          }
          if ((!bVar2 && !bVar4) && (bVar3 && iVar5 != 0)) {
            local_88._private = (void *)0x0;
            local_88.context = (_xmlDoc *)0x0;
            local_88.href = (xmlChar *)0x0;
            local_88.prefix = (xmlChar *)0x0;
            local_88.next = (_xmlNs *)0x0;
            local_88.type = 0;
            local_88._12_4_ = 0;
            iVar6 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,&local_88,ctx);
            if (iVar6 == 0) {
              xmlC14NPrintNamespaces(&local_88,ctx);
            }
          }
          else if ((bool)((iVar5 != 0 && !bVar2) & bVar4)) goto LAB_0015e960;
          goto LAB_0015ea29;
        }
LAB_0015e7ad:
        iVar6 = xmlC14NIsXmlNs((xmlNsPtr)pxVar9);
        if (iVar6 != 0) goto LAB_0015e824;
        if (iVar5 == 0) {
LAB_0015e810:
          iVar6 = xmlStrlen((xmlChar *)pxVar9->children);
          if (iVar6 == 0) {
            bVar2 = true;
          }
          goto LAB_0015e824;
        }
        if (((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
            (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur), iVar6 != 0)) &&
           (iVar6 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar9,ctx), iVar6 == 0)
           ) {
          xmlListInsert(local_98,pxVar9);
        }
        iVar6 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar9,cur);
        if (-1 < iVar6) goto LAB_0015e810;
LAB_0015e996:
        ctx->error = 2;
        xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x15,
                            (xmlError *)0x0);
      }
      else {
        if (cur->type != XML_ELEMENT_NODE) goto LAB_0015ecc9;
        local_98 = xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
        if (local_98 == (xmlListPtr)0x0) goto LAB_0015ebf5;
        bVar2 = false;
        p_Var12 = cur;
        do {
          for (pxVar9 = (xmlNodePtr)p_Var12->nsDef; pxVar9 != (xmlNodePtr)0x0;
              pxVar9 = (xmlNodePtr)pxVar9->_private) {
            pxVar10 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)pxVar9->children);
            if (((pxVar10 == pxVar9) && (iVar6 = xmlC14NIsXmlNs((xmlNsPtr)pxVar9), iVar6 == 0)) &&
               ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                (iVar6 = (*ctx->is_visible_callback)(ctx->user_data,pxVar9,cur), iVar6 != 0)))) {
              iVar6 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar9);
              if ((iVar5 != 0) &&
                 (iVar7 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar9,cur), iVar7 < 0
                 )) goto LAB_0015e996;
              if (iVar6 == 0) {
                xmlListInsert(local_98,pxVar9);
              }
              iVar6 = xmlStrlen((xmlChar *)pxVar9->children);
              if (iVar6 == 0) {
                bVar2 = true;
              }
            }
          }
          p_Var12 = p_Var12->parent;
        } while (p_Var12 != (_xmlNode *)0x0);
        if ((iVar5 != 0) && (!bVar2)) {
LAB_0015e960:
          local_88._private = (void *)0x0;
          local_88.context = (_xmlDoc *)0x0;
          local_88.href = (xmlChar *)0x0;
          local_88.prefix = (xmlChar *)0x0;
          local_88.next = (_xmlNs *)0x0;
          local_88.type = 0;
          local_88._12_4_ = 0;
          iVar6 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,&local_88);
          if (iVar6 == 0) {
            xmlC14NPrintNamespaces(&local_88,ctx);
          }
        }
LAB_0015ea29:
        xmlListWalk(local_98,xmlC14NPrintNamespacesWalker,ctx);
      }
      xmlListDelete(local_98);
      if (iVar5 == 0) {
        iVar6 = xmlC14NProcessAttrsAxis(ctx,cur,0);
        if (iVar6 < 0) {
          return -1;
        }
      }
      else {
        p_Var1 = ctx->ns_rendered;
        if (p_Var1 == (xmlC14NVisibleNsStackPtr)0x0) {
          xmlC14NErrFull((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0)
          ;
        }
        else {
          p_Var1->nsPrevStart = p_Var1->nsPrevEnd;
          p_Var1->nsPrevEnd = p_Var1->nsCurEnd;
        }
        iVar6 = xmlC14NProcessAttrsAxis(ctx,cur,iVar5);
        if (iVar6 < 0) {
          return -1;
        }
        xmlOutputBufferWriteString(ctx->buf,">");
      }
      if ((cur->children != (xmlNodePtr)0x0) &&
         (iVar6 = xmlC14NProcessNodeList(ctx,cur->children), iVar6 < 0)) {
        return -1;
      }
      if (iVar5 != 0) {
        xmlOutputBufferWriteString(ctx->buf,"</");
        if ((cur->ns != (xmlNs *)0x0) && (iVar5 = xmlStrlen(cur->ns->prefix), 0 < iVar5)) {
          xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
          xmlOutputBufferWriteString(ctx->buf,":");
        }
        xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
        xmlOutputBufferWriteString(ctx->buf,">");
        if (local_8c != 0) {
          ctx->parent_is_doc = local_8c;
          ctx->pos = XMLC14N_AFTER_DOCUMENT_ELEMENT;
        }
      }
      p_Var1 = ctx->ns_rendered;
      if (p_Var1 == (xmlC14NVisibleNsStackPtr)0x0) {
        iVar6 = 0;
        xmlC14NErrFull((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0);
      }
      else {
        p_Var1->nsCurEnd = (undefined4)local_48;
        p_Var1->nsPrevStart = local_48._4_4_;
        p_Var1->nsPrevEnd = (int)local_50;
        iVar6 = 0;
      }
      break;
    case XML_ATTRIBUTE_NODE:
      pcVar11 = "XML_ATTRIBUTE_NODE";
      goto LAB_0015ec7b;
    case XML_TEXT_NODE:
    case XML_CDATA_SECTION_NODE:
      iVar6 = iVar7;
      if ((iVar5 != 0) && (cur->content != (xmlChar *)0x0)) {
        pxVar8 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_TEXT);
        if (pxVar8 == (xmlChar *)0x0) {
          ctx->error = 2;
          xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x15,
                              (xmlError *)0x0);
        }
        else {
          xmlOutputBufferWriteString(ctx->buf,(char *)pxVar8);
          (*xmlFree)(pxVar8);
        }
        iVar6 = -(uint)(pxVar8 == (xmlChar *)0x0);
      }
      break;
    case XML_ENTITY_REF_NODE:
      pcVar11 = "XML_ENTITY_REF_NODE";
      goto LAB_0015ec7b;
    case XML_ENTITY_NODE:
      pcVar11 = "XML_ENTITY_NODE";
      goto LAB_0015ec7b;
    case XML_PI_NODE:
      iVar6 = iVar7;
      if (iVar5 != 0) {
        pcVar11 = "<?";
        if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
          pcVar11 = "\n<?";
        }
        xmlOutputBufferWriteString(ctx->buf,pcVar11);
        xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
        if ((cur->content != (xmlChar *)0x0) && (*cur->content != '\0')) {
          xmlOutputBufferWriteString(ctx->buf," ");
          pxVar8 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_PI);
          if (pxVar8 == (xmlChar *)0x0) goto LAB_0015ebf5;
          xmlOutputBufferWriteString(ctx->buf,(char *)pxVar8);
          (*xmlFree)(pxVar8);
        }
        out = ctx->buf;
        if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
          pcVar11 = "?>\n";
        }
        else {
          pcVar11 = "?>";
        }
LAB_0015e9d4:
        xmlOutputBufferWriteString(out,pcVar11);
        iVar6 = iVar7;
      }
      break;
    case XML_COMMENT_NODE:
      iVar6 = iVar7;
      if ((iVar5 != 0) && (ctx->with_comments != 0)) {
        pcVar11 = "<!--";
        if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
          pcVar11 = "\n<!--";
        }
        xmlOutputBufferWriteString(ctx->buf,pcVar11);
        if (cur->content != (xmlChar *)0x0) {
          pxVar8 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_COMMENT);
          if (pxVar8 == (xmlChar *)0x0) goto LAB_0015ebf5;
          xmlOutputBufferWriteString(ctx->buf,(char *)pxVar8);
          (*xmlFree)(pxVar8);
        }
        out = ctx->buf;
        if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
          pcVar11 = "-->\n";
        }
        else {
          pcVar11 = "-->";
        }
        goto LAB_0015e9d4;
      }
      break;
    case XML_DOCUMENT_NODE:
    case XML_DOCUMENT_FRAG_NODE:
    case XML_HTML_DOCUMENT_NODE:
      pxVar9 = cur->children;
      if (pxVar9 != (xmlNodePtr)0x0) {
        ctx->pos = XMLC14N_BEFORE_DOCUMENT_ELEMENT;
        ctx->parent_is_doc = 1;
        iVar6 = xmlC14NProcessNodeList(ctx,pxVar9);
      }
      break;
    case XML_DOCUMENT_TYPE_NODE:
    case XML_NOTATION_NODE:
    case XML_DTD_NODE:
    case XML_ELEMENT_DECL:
    case XML_ATTRIBUTE_DECL:
    case XML_ENTITY_DECL:
    case XML_XINCLUDE_START:
    case XML_XINCLUDE_END:
      break;
    case XML_NAMESPACE_DECL:
      pcVar11 = "XML_NAMESPACE_DECL";
LAB_0015ec7b:
      msg = "Node %s is invalid here : %s\n";
      str1 = "processing node";
      cur = (xmlNodePtr)0x0;
      iVar5 = 0x7a1;
LAB_0015ec85:
      xmlC14NErrFull(ctx,cur,iVar5,str1,msg,pcVar11);
      return -1;
    default:
      xmlC14NErrFull(ctx,(xmlNodePtr)0x0,0x7a2,"processing node","Unknown node type %d found : %s\n"
                     ,(ulong)cur->type,"processing node");
      return -1;
    }
    cur = cur->next;
    if (cur == (_xmlNode *)0x0) {
      return iVar6;
    }
    if (iVar6 < 0) {
      return iVar6;
    }
  } while( true );
}

Assistant:

static int
xmlC14NProcessNodeList(xmlC14NCtxPtr ctx, xmlNodePtr cur)
{
    int ret;

    if (ctx == NULL) {
        xmlC14NErrParam(ctx);
        return (-1);
    }

    for (ret = 0; cur != NULL && ret >= 0; cur = cur->next) {
        ret = xmlC14NProcessNode(ctx, cur);
    }
    return (ret);
}